

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O3

void __thiscall raspicam::_private::Private_Impl_Still::disconnectPorts(Private_Impl_Still *this)

{
  char *pcVar1;
  MMAL_STATUS_T MVar2;
  size_t sVar3;
  MMAL_CONNECTION_T *connection;
  
  connection = this->encoder_connection;
  if (connection->is_enabled != 0) {
    MVar2 = mmal_connection_disable(connection);
    if (MVar2 != MMAL_SUCCESS) {
      pcVar1 = this->API_NAME;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
      }
      else {
        sVar3 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,": fail to disable encoder connection\n",0x25);
    }
    connection = this->encoder_connection;
    if (connection == (MMAL_CONNECTION_T *)0x0) {
      return;
    }
  }
  MVar2 = mmal_connection_destroy(connection);
  if (MVar2 == MMAL_SUCCESS) {
    return;
  }
  pcVar1 = this->API_NAME;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1130c0);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,": fail to destroy encoder connection\n",0x25);
  return;
}

Assistant:

void Private_Impl_Still::disconnectPorts() {
            // disable connection if enabled
            if ( encoder_connection->is_enabled && mmal_connection_disable( encoder_connection ) != MMAL_SUCCESS ) {
                cout << API_NAME << ": fail to disable encoder connection\n";
            }

            // destroy encoder connection
            // mmal_connection_disable call is mandatory before calling the destroy function otherwise it fails
            if ( encoder_connection && mmal_connection_destroy( encoder_connection ) != MMAL_SUCCESS ) {
                cout << API_NAME << ": fail to destroy encoder connection\n";
            }
        }